

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fTextureFormatTests.cpp
# Opt level: O2

int __thiscall
deqp::gles2::Functional::TextureFormatTests::init(TextureFormatTests *this,EVP_PKEY_CTX *ctx)

{
  deUint32 format;
  TestContext *pTVar1;
  RenderContext *pRVar2;
  Context *pCVar3;
  ContextInfo *renderCtxInfo;
  _Alloc_hider _Var4;
  int extraout_EAX;
  char *pcVar5;
  Texture2DFormatCase *pTVar6;
  TextureCubeFormatCase *pTVar7;
  Compressed2DFormatCase *pCVar8;
  CompressedCubeFormatCase *pCVar9;
  long lVar10;
  allocator<char> local_129;
  ulong local_128;
  int local_11c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  string descriptionBase;
  string nameBase;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  npotFilenames;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  potFilenames;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  
  for (lVar10 = 0; lVar10 != 0x80; lVar10 = lVar10 + 0x10) {
    format = *(deUint32 *)((long)&DAT_01e137d8 + lVar10);
    local_128 = (ulong)*(uint *)((long)&DAT_01e137dc + lVar10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&nameBase,*(char **)((long)&DAT_01e137d0 + lVar10),
               (allocator<char> *)&descriptionBase);
    pcVar5 = glu::getTextureFormatName(format);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&npotFilenames,pcVar5,(allocator<char> *)&local_70);
    std::operator+(&local_118,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &npotFilenames,", ");
    pcVar5 = glu::getTypeName((int)local_128);
    std::operator+(&descriptionBase,&local_118,pcVar5);
    std::__cxx11::string::~string((string *)&local_118);
    std::__cxx11::string::~string((string *)&npotFilenames);
    pTVar6 = (Texture2DFormatCase *)operator_new(0xe8);
    pTVar1 = (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx;
    pRVar2 = ((this->super_TestCaseGroup).m_context)->m_renderCtx;
    std::operator+(&local_118,&nameBase,"_2d_pot");
    _Var4._M_p = local_118._M_dataplus._M_p;
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &npotFilenames,&descriptionBase,", GL_TEXTURE_2D");
    Texture2DFormatCase::Texture2DFormatCase
              (pTVar6,pTVar1,pRVar2,_Var4._M_p,
               (char *)npotFilenames.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start,format,(deUint32)local_128,0x80,
               0x80);
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar6);
    std::__cxx11::string::~string((string *)&npotFilenames);
    std::__cxx11::string::~string((string *)&local_118);
    pTVar6 = (Texture2DFormatCase *)operator_new(0xe8);
    pTVar1 = (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx;
    pRVar2 = ((this->super_TestCaseGroup).m_context)->m_renderCtx;
    std::operator+(&local_118,&nameBase,"_2d_npot");
    _Var4._M_p = local_118._M_dataplus._M_p;
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &npotFilenames,&descriptionBase,", GL_TEXTURE_2D");
    Texture2DFormatCase::Texture2DFormatCase
              (pTVar6,pTVar1,pRVar2,_Var4._M_p,
               (char *)npotFilenames.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start,format,(deUint32)local_128,0x3f,
               0x70);
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar6);
    std::__cxx11::string::~string((string *)&npotFilenames);
    std::__cxx11::string::~string((string *)&local_118);
    pTVar7 = (TextureCubeFormatCase *)operator_new(0xf0);
    pTVar1 = (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx;
    pRVar2 = ((this->super_TestCaseGroup).m_context)->m_renderCtx;
    std::operator+(&local_118,&nameBase,"_cube_pot");
    _Var4._M_p = local_118._M_dataplus._M_p;
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &npotFilenames,&descriptionBase,", GL_TEXTURE_CUBE_MAP");
    TextureCubeFormatCase::TextureCubeFormatCase
              (pTVar7,pTVar1,pRVar2,_Var4._M_p,
               (char *)npotFilenames.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start,format,(deUint32)local_128,0x40,
               0x40);
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar7);
    std::__cxx11::string::~string((string *)&npotFilenames);
    std::__cxx11::string::~string((string *)&local_118);
    pTVar7 = (TextureCubeFormatCase *)operator_new(0xf0);
    pTVar1 = (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx;
    pRVar2 = ((this->super_TestCaseGroup).m_context)->m_renderCtx;
    std::operator+(&local_118,&nameBase,"_cube_npot");
    _Var4._M_p = local_118._M_dataplus._M_p;
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &npotFilenames,&descriptionBase,", GL_TEXTURE_CUBE_MAP");
    TextureCubeFormatCase::TextureCubeFormatCase
              (pTVar7,pTVar1,pRVar2,_Var4._M_p,
               (char *)npotFilenames.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start,format,(deUint32)local_128,0x39,
               0x39);
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar7);
    std::__cxx11::string::~string((string *)&npotFilenames);
    std::__cxx11::string::~string((string *)&local_118);
    std::__cxx11::string::~string((string *)&descriptionBase);
    std::__cxx11::string::~string((string *)&nameBase);
  }
  pCVar8 = (Compressed2DFormatCase *)operator_new(0xf8);
  pTVar1 = (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx;
  pCVar3 = (this->super_TestCaseGroup).m_context;
  pRVar2 = pCVar3->m_renderCtx;
  renderCtxInfo = pCVar3->m_contextInfo;
  toStringVector_abi_cxx11_
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&nameBase,(Functional *)init::filenames,(char **)0x8,(int)this);
  Compressed2DFormatCase::Compressed2DFormatCase
            (pCVar8,pTVar1,pRVar2,renderCtxInfo,"etc1_2d_pot","GL_ETC1_RGB8_OES, GL_TEXTURE_2D",
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&nameBase);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pCVar8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&nameBase);
  descriptionBase._M_dataplus._M_p = (pointer)0x0;
  descriptionBase._M_string_length = 0;
  descriptionBase.field_2._M_allocated_capacity = 0;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&nameBase,"data/etc1/photo_helsinki_113x89.pkm",(allocator<char> *)&local_118
            );
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&descriptionBase,
             &nameBase);
  std::__cxx11::string::~string((string *)&nameBase);
  pCVar8 = (Compressed2DFormatCase *)operator_new(0xf8);
  pCVar3 = (this->super_TestCaseGroup).m_context;
  Compressed2DFormatCase::Compressed2DFormatCase
            (pCVar8,(this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             pCVar3->m_renderCtx,pCVar3->m_contextInfo,"etc1_2d_npot",
             "GL_ETC1_RGB8_OES, GL_TEXTURE_2D",
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&descriptionBase);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pCVar8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&descriptionBase);
  potFilenames.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  potFilenames.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  potFilenames.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  for (local_11c = 0; local_11c < 7; local_11c = local_11c + 1) {
    for (lVar10 = 0; lVar10 != 0x30; lVar10 = lVar10 + 8) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_70,"data/etc1/skybox_",&local_129);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &npotFilenames,&local_70,*(char **)((long)init::faceExt + lVar10));
      std::operator+(&local_118,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &npotFilenames,"_mip_");
      de::toString<int>(&local_50,&local_11c);
      std::operator+(&descriptionBase,&local_118,&local_50);
      std::operator+(&nameBase,&descriptionBase,".pkm");
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&potFilenames,
                 &nameBase);
      std::__cxx11::string::~string((string *)&nameBase);
      std::__cxx11::string::~string((string *)&descriptionBase);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string((string *)&local_118);
      std::__cxx11::string::~string((string *)&npotFilenames);
      std::__cxx11::string::~string((string *)&local_70);
    }
  }
  pCVar9 = (CompressedCubeFormatCase *)operator_new(0x100);
  pCVar3 = (this->super_TestCaseGroup).m_context;
  CompressedCubeFormatCase::CompressedCubeFormatCase
            (pCVar9,(this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             pCVar3->m_renderCtx,pCVar3->m_contextInfo,"etc1_cube_pot",
             "GL_ETC1_RGB8_OES, GL_TEXTURE_CUBE_MAP",&potFilenames);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pCVar9);
  npotFilenames.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  npotFilenames.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  npotFilenames.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  for (lVar10 = 0; lVar10 != 0x30; lVar10 = lVar10 + 8) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_118,"data/etc1/skybox_61x61_",(allocator<char> *)&local_70);
    std::operator+(&descriptionBase,&local_118,*(char **)((long)init::faceExt + lVar10));
    std::operator+(&nameBase,&descriptionBase,".pkm");
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&npotFilenames,
               &nameBase);
    std::__cxx11::string::~string((string *)&nameBase);
    std::__cxx11::string::~string((string *)&descriptionBase);
    std::__cxx11::string::~string((string *)&local_118);
  }
  pCVar9 = (CompressedCubeFormatCase *)operator_new(0x100);
  pCVar3 = (this->super_TestCaseGroup).m_context;
  CompressedCubeFormatCase::CompressedCubeFormatCase
            (pCVar9,(this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             pCVar3->m_renderCtx,pCVar3->m_contextInfo,"etc1_cube_npot",
             "GL_ETC_RGB8_OES, GL_TEXTURE_CUBE_MAP",&npotFilenames);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pCVar9);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&npotFilenames);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&potFilenames);
  return extraout_EAX;
}

Assistant:

void TextureFormatTests::init (void)
{
	struct
	{
		const char*	name;
		deUint32		format;
		deUint32		dataType;
	} texFormats[] =
	{
		{ "a8",			GL_ALPHA,			GL_UNSIGNED_BYTE },
		{ "l8",			GL_LUMINANCE,		GL_UNSIGNED_BYTE },
		{ "la88",		GL_LUMINANCE_ALPHA,	GL_UNSIGNED_BYTE },
		{ "rgb565",		GL_RGB,				GL_UNSIGNED_SHORT_5_6_5 },
		{ "rgb888",		GL_RGB,				GL_UNSIGNED_BYTE },
		{ "rgba4444",	GL_RGBA,			GL_UNSIGNED_SHORT_4_4_4_4 },
		{ "rgba5551",	GL_RGBA,			GL_UNSIGNED_SHORT_5_5_5_1 },
		{ "rgba8888",	GL_RGBA,			GL_UNSIGNED_BYTE }
	};

	for (int formatNdx = 0; formatNdx < DE_LENGTH_OF_ARRAY(texFormats); formatNdx++)
	{
		deUint32	format			= texFormats[formatNdx].format;
		deUint32	dataType		= texFormats[formatNdx].dataType;
		string	nameBase		= texFormats[formatNdx].name;
		string	descriptionBase	= string(glu::getTextureFormatName(format)) + ", " + glu::getTypeName(dataType);

		addChild(new Texture2DFormatCase	(m_testCtx, m_context.getRenderContext(),	(nameBase + "_2d_pot").c_str(),		(descriptionBase + ", GL_TEXTURE_2D").c_str(),			format, dataType, 128, 128));
		addChild(new Texture2DFormatCase	(m_testCtx, m_context.getRenderContext(),	(nameBase + "_2d_npot").c_str(),	(descriptionBase + ", GL_TEXTURE_2D").c_str(),			format, dataType,  63, 112));
		addChild(new TextureCubeFormatCase	(m_testCtx, m_context.getRenderContext(),	(nameBase + "_cube_pot").c_str(),	(descriptionBase + ", GL_TEXTURE_CUBE_MAP").c_str(),	format, dataType,  64,  64));
		addChild(new TextureCubeFormatCase	(m_testCtx, m_context.getRenderContext(),	(nameBase + "_cube_npot").c_str(),	(descriptionBase + ", GL_TEXTURE_CUBE_MAP").c_str(),	format, dataType,  57,  57));
	}

	// ETC-1 compressed formats.
	{
		static const char* filenames[] =
		{
			"data/etc1/photo_helsinki_mip_0.pkm",
			"data/etc1/photo_helsinki_mip_1.pkm",
			"data/etc1/photo_helsinki_mip_2.pkm",
			"data/etc1/photo_helsinki_mip_3.pkm",
			"data/etc1/photo_helsinki_mip_4.pkm",
			"data/etc1/photo_helsinki_mip_5.pkm",
			"data/etc1/photo_helsinki_mip_6.pkm",
			"data/etc1/photo_helsinki_mip_7.pkm"
		};
		addChild(new Compressed2DFormatCase(m_testCtx, m_context.getRenderContext(), m_context.getContextInfo(), "etc1_2d_pot", "GL_ETC1_RGB8_OES, GL_TEXTURE_2D", toStringVector(filenames, DE_LENGTH_OF_ARRAY(filenames))));
	}

	{
		vector<string> filenames;
		filenames.push_back("data/etc1/photo_helsinki_113x89.pkm");
		addChild(new Compressed2DFormatCase(m_testCtx, m_context.getRenderContext(), m_context.getContextInfo(), "etc1_2d_npot", "GL_ETC1_RGB8_OES, GL_TEXTURE_2D", filenames));
	}

	{
		static const char* faceExt[] = { "neg_x", "pos_x", "neg_y", "pos_y", "neg_z", "pos_z" };

		const int		potNumLevels	= 7;
		vector<string>	potFilenames;
		for (int level = 0; level < potNumLevels; level++)
			for (int face = 0; face < tcu::CUBEFACE_LAST; face++)
				potFilenames.push_back(string("data/etc1/skybox_") + faceExt[face] + "_mip_" + de::toString(level) + ".pkm");

		addChild(new CompressedCubeFormatCase(m_testCtx, m_context.getRenderContext(), m_context.getContextInfo(), "etc1_cube_pot", "GL_ETC1_RGB8_OES, GL_TEXTURE_CUBE_MAP", potFilenames));

		vector<string> npotFilenames;
		for (int face = 0; face < tcu::CUBEFACE_LAST; face++)
			npotFilenames.push_back(string("data/etc1/skybox_61x61_") + faceExt[face] + ".pkm");

		addChild(new CompressedCubeFormatCase(m_testCtx, m_context.getRenderContext(), m_context.getContextInfo(), "etc1_cube_npot", "GL_ETC_RGB8_OES, GL_TEXTURE_CUBE_MAP", npotFilenames));
	}
}